

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_79(QPDF *pdf,char *arg2)

{
  int iVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  void *__s1;
  void *__s2;
  size_t __n;
  long lVar4;
  int iVar5;
  QPDFObjectHandle QVar6;
  initializer_list<QPDFObjectHandle> __l;
  allocator<char> local_1f9;
  shared_ptr<Buffer> copy_data;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  shared_ptr<Buffer> bp;
  QPDFObjectHandle orig;
  QPDFObjectHandle s3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  Pl_Buffer b;
  shared_ptr<Buffer> orig_data;
  QPDFObjectHandle s2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  QPDFObjectHandle copy;
  QPDFObjectHandle copies;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  QPDFObjectHandle s1;
  value_type p1;
  QPDFObjectHandle null;
  string local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  QPDFObjectHandle::newArray();
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,"/Copies",(allocator<char> *)&copy_data);
  QPDFObjectHandle::replaceKey((string *)&w,(QPDFObjectHandle *)&b);
  std::__cxx11::string::~string((string *)&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0);
  QPDFObjectHandle::newNull();
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p1,p_Var2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&b,"/Contents",(allocator<char> *)&w)
  ;
  QPDFObjectHandle::getKey((string *)&s1);
  std::__cxx11::string::~string((string *)&b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,"from string",(allocator<char> *)&w);
  QPDFObjectHandle::newStream((QPDF *)&s2,(string *)pdf);
  std::__cxx11::string::~string((string *)&b);
  QPDFObjectHandle::getDict();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,"/Stuff",(allocator<char> *)&orig_data);
  QPDFObjectHandle::newInteger((longlong)local_90);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&orig;
  QPDF::makeIndirectObject(QVar6);
  QPDFObjectHandle::unparse_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copy_data,
                 "<< /Direct 3 /Indirect ",&local_178);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copy_data,
                 ">>");
  std::__cxx11::string::string<std::allocator<char>>((string *)&streams,"",(allocator<char> *)&copy)
  ;
  QPDFObjectHandle::parse((QPDF *)&s3,(string *)pdf,(string *)&w);
  QPDFObjectHandle::replaceKey((string *)&bp,(QPDFObjectHandle *)&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&streams);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&copy_data);
  std::__cxx11::string::~string((string *)&local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&orig.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::getDict();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,"/Other",(allocator<char> *)&streams);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"other stuff",(allocator<char> *)&bp);
  QPDFObjectHandle::newString((string *)&local_178);
  QPDFObjectHandle::replaceKey((string *)&copy_data,(QPDFObjectHandle *)&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&copy_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Pl_Buffer::Pl_Buffer(&b,"buffer",(Pipeline *)0x0);
  Pipeline::writeCStr((char *)&b);
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  QPDFObjectHandle::newStream(&s3,pdf,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s2);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&s3);
  __l._M_len = 3;
  __l._M_array = (iterator)&w;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            (&streams,__l,(allocator_type *)&copy_data);
  lVar4 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&w + lVar4));
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -8);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/Originals",(allocator<char> *)&orig);
  QPDFObjectHandle::newArray((vector *)&local_178);
  QPDFObjectHandle::replaceKey((string *)&copy_data,(QPDFObjectHandle *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&copy_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  iVar5 = 1;
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (p_Var2 == (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                  streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
      QPDFWriter::setStaticID(SUB81(&w,0));
      QPDFWriter::setQDFMode(SUB81(&w,0));
      QPDFWriter::write();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&streams);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&s3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&bp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Pl_Buffer::~Pl_Buffer(&b);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&s2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&s1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&null.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&copies.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&orig,p_Var2);
    QUtil::int_to_string_abi_cxx11_((longlong)&w,iVar5);
    QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&orig_data);
    QPDFObjectHandle::copyStream();
    QPDFObjectHandle::getDict();
    std::__cxx11::string::string<std::allocator<char>>((string *)&copy_data,"/Other",&local_1f9);
    std::operator+(&local_178,"other: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w);
    QPDFObjectHandle::newString(local_50);
    QPDFObjectHandle::replaceKey(local_a0,(QPDFObjectHandle *)&copy_data);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&copy_data);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copy_data,
                   "something new ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w);
    QPDFObjectHandle::replaceStreamData((string *)&orig,(QPDFObjectHandle *)&copy_data,&null);
    std::__cxx11::string::~string((string *)&copy_data);
    QPDFObjectHandle::getStreamData
              ((qpdf_stream_decode_level_e)
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copy_data);
    lVar4 = Buffer::getSize();
    lVar3 = Buffer::getSize();
    if (lVar4 != lVar3) break;
    __s1 = (void *)Buffer::getBuffer();
    __s2 = (void *)Buffer::getBuffer();
    __n = Buffer::getSize();
    iVar1 = bcmp(__s1,__s2,__n);
    if (iVar1 != 0) {
      __assert_fail("memcmp(orig_data->getBuffer(), copy_data->getBuffer(), orig_data->getSize()) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xad1,"void test_79(QPDF &, const char *)");
    }
    QPDFObjectHandle::appendItem(&copies);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&copy_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&copy.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&orig_data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&orig.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    p_Var2 = p_Var2 + 1;
    iVar5 = iVar5 + 1;
  }
  __assert_fail("orig_data->getSize() == copy_data->getSize()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xad0,"void test_79(QPDF &, const char *)");
}

Assistant:

static void
test_79(QPDF& pdf, char const* arg2)
{
    // Exercise stream copier

    // Copy streams. Modify the original and make sure the copy is
    // unaffected.
    auto copies = QPDFObjectHandle::newArray();
    pdf.getTrailer().replaceKey("/Copies", copies);
    auto null = QPDFObjectHandle::newNull();

    // Get a regular stream from the file
    auto p1 = pdf.getAllPages().at(0);
    auto s1 = p1.getKey("/Contents");

    // Create a stream from a string
    auto s2 = QPDFObjectHandle::newStream(&pdf, "from string");
    // Add direct and indirect objects to the dictionary
    s2.getDict().replaceKey(
        "/Stuff",
        QPDFObjectHandle::parse(
            &pdf,
            "<< /Direct 3 /Indirect " +
                pdf.makeIndirectObject(QPDFObjectHandle::newInteger(16059)).unparse() + ">>"));
    s2.getDict().replaceKey("/Other", QPDFObjectHandle::newString("other stuff"));

    // Use a provider
    Pl_Buffer b("buffer");
    b.writeCStr("from buffer");
    b.finish();
    auto bp = b.getBufferSharedPointer();
    auto s3 = QPDFObjectHandle::newStream(&pdf, bp);

    std::vector<QPDFObjectHandle> streams = {s1, s2, s3};
    pdf.getTrailer().replaceKey("/Originals", QPDFObjectHandle::newArray(streams));

    int i = 0;
    for (auto orig: streams) {
        ++i;
        auto istr = QUtil::int_to_string(i);
        auto orig_data = orig.getStreamData();
        auto copy = orig.copyStream();
        copy.getDict().replaceKey("/Other", QPDFObjectHandle::newString("other: " + istr));
        orig.replaceStreamData("something new " + istr, null, null);
        auto copy_data = copy.getStreamData();
        assert(orig_data->getSize() == copy_data->getSize());
        assert(memcmp(orig_data->getBuffer(), copy_data->getBuffer(), orig_data->getSize()) == 0);
        copies.appendItem(copy);
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}